

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

bool jessilib::is_valid<std::basic_string_view<char16_t,std::char_traits<char16_t>>>
               (basic_string_view<char16_t,_std::char_traits<char16_t>_> *in_string)

{
  char16_t *pcVar1;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_00;
  bool bVar2;
  decode_result dVar3;
  decode_result string_front;
  InViewT in_string_view;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *in_string_local;
  
  string_front.units = in_string->_M_len;
  pcVar1 = in_string->_M_str;
  while( true ) {
    bVar2 = std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::empty
                      ((basic_string_view<char16_t,_std::char_traits<char16_t>_> *)
                       &string_front.units);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return true;
    }
    in_string_00._M_str = pcVar1;
    in_string_00._M_len = string_front.units;
    dVar3 = decode_codepoint<char16_t>(in_string_00);
    string_front._0_8_ = dVar3.units;
    if (string_front._0_8_ == 0) break;
    std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::remove_prefix
              ((basic_string_view<char16_t,_std::char_traits<char16_t>_> *)&string_front.units,
               string_front._0_8_);
  }
  return false;
}

Assistant:

bool is_valid(const InT& in_string) {
	using InCharT = typename impl_unicode::is_string<InT>::type;
	using InViewT = std::basic_string_view<InCharT>;

	InViewT in_string_view = static_cast<InViewT>(in_string);
	while (!in_string_view.empty()) {
		decode_result string_front = decode_codepoint(in_string_view);
		if (string_front.units == 0) {
			return false;
		}
		in_string_view.remove_prefix(string_front.units);
	}

	return true;
}